

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCGeometryCollider.cpp
# Opt level: O3

int chrono::collision::ChGeometryCollider::ComputeBoxBoxCollisions
              (ChBox *mgeo1,ChMatrix33<double> *R1,Vector *T1,ChBox *mgeo2,ChMatrix33<double> *R2,
              Vector *T2,ChNarrowPhaseCollider *mcollider,bool just_intersection)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  bool bVar7;
  uint uVar8;
  ulong uVar9;
  RhsEtorType *p;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ChVector<float> local_2c8;
  ChVector<double> result;
  DstEvaluatorType dstEvaluator;
  Vector local_278;
  Vector local_258;
  undefined1 local_238 [16];
  double local_228;
  ChMatrix33<double> relRot;
  double ArrDist [12];
  SrcEvaluatorType srcEvaluator;
  
  if (just_intersection) {
    ArrDist[0] = (double)&dstEvaluator;
    ArrDist[1] = (double)&srcEvaluator;
    ArrDist[2] = (double)&result;
    srcEvaluator.
    super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_innerDim = 3;
    dstEvaluator.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d
    .data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>)
            (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>)&relRot;
    ArrDist[3] = (double)&relRot;
    srcEvaluator.
    super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhs.m_matrix = &R1->super_Matrix<double,_3,_3,_1,_3,_3>;
    srcEvaluator.
    super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_rhs = &R2->super_Matrix<double,_3,_3,_1,_3,_3>;
    srcEvaluator.
    super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhsImpl.
    super_unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::IndexBased,_double>
    .m_argImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
    data = (unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::IndexBased,_double>
            )(unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::IndexBased,_double>
              )R1;
    srcEvaluator.
    super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_rhsImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
    data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>)
           (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>)R2;
    Eigen::internal::
    copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *)ArrDist);
    dVar3 = T2->m_data[1] - T1->m_data[1];
    dVar4 = T2->m_data[0] - T1->m_data[0];
    dVar5 = T2->m_data[2] - T1->m_data[2];
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (R1->super_Matrix<double,_3,_3,_1,_3,_3>).
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[2];
    auVar10._8_8_ = 0;
    auVar10._0_8_ = dVar4;
    auVar15._8_8_ = 0;
    auVar15._0_8_ =
         dVar3 * (R1->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
    auVar6 = vfmadd231sd_fma(auVar15,auVar10,auVar1);
    auVar12._0_8_ =
         dVar3 * (R1->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
    auVar12._8_8_ =
         dVar3 * (R1->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
    auVar11._8_8_ = dVar4;
    auVar11._0_8_ = dVar4;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (R1->super_Matrix<double,_3,_3,_1,_3,_3>).
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[8];
    auVar14._8_8_ = 0;
    auVar14._0_8_ = dVar5;
    auVar16 = vfmadd231sd_fma(auVar6,auVar14,auVar2);
    auVar6 = vfmadd132pd_fma(auVar11,auVar12,
                             *(undefined1 (*) [16])
                              (R1->super_Matrix<double,_3,_3,_1,_3,_3>).
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data.array);
    auVar13._8_8_ = dVar5;
    auVar13._0_8_ = dVar5;
    local_238 = vfmadd132pd_fma(auVar13,auVar6,
                                *(undefined1 (*) [16])
                                 ((R1->super_Matrix<double,_3,_3,_1,_3,_3>).
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                  m_storage.m_data.array + 6));
    local_228 = auVar16._0_8_;
    local_258.m_data[0] = (mgeo1->Size).m_data[0];
    local_258.m_data[1] = (mgeo1->Size).m_data[1];
    local_258.m_data[2] = (mgeo1->Size).m_data[2];
    local_278.m_data[0] = (mgeo2->Size).m_data[0];
    local_278.m_data[1] = (mgeo2->Size).m_data[1];
    local_278.m_data[2] = (mgeo2->Size).m_data[2];
    bVar7 = CHOBB::OBB_Overlap(&relRot,(Vector *)local_238,&local_258,&local_278);
    if (bVar7) {
      ChCollisionPair::ChCollisionPair
                ((ChCollisionPair *)&srcEvaluator,(ChGeometry *)mgeo1,(ChGeometry *)mgeo2);
      ChNarrowPhaseCollider::AddCollisionPair(mcollider,(ChCollisionPair *)&srcEvaluator);
      return 1;
    }
  }
  else {
    p = (RhsEtorType *)&srcEvaluator;
    srcEvaluator.
    super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhs.m_matrix = (non_const_type)0x0;
    srcEvaluator.
    super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_rhs = (type)0x0;
    srcEvaluator.
    super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhsImpl.
    super_unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::IndexBased,_double>
    .m_argImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
    data = (unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::IndexBased,_double>
            )(evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>)0x0;
    srcEvaluator.
    super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_rhsImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
    data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>)
           (plainobjectbase_evaluator_data<double,_3>)0x0;
    srcEvaluator.
    super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_innerDim = 0;
    relRot.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0022;
    dstEvaluator.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d
    .data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>)
            (plainobjectbase_evaluator_data<double,_3>)0x0;
    uVar8 = BoxBoxCollisionTest2::BoxBoxContacts
                      (T1,R1,&mgeo1->Size,T2,R2,&mgeo2->Size,(double *)&relRot,(Vector *)p,
                       (Vector *)&dstEvaluator,ArrDist);
    if (0 < (int)uVar8) {
      uVar9 = 0;
      do {
        dVar3 = ArrDist[uVar9];
        if (dVar3 < 0.0022) {
          auVar6._8_8_ = 0;
          auVar6._0_8_ = dstEvaluator.
                         super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                         .m_d.data;
          auVar16._0_8_ =
               dVar3 * (double)dstEvaluator.
                               super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                               .m_d.data;
          auVar16._8_8_ = dVar3 * 0.0;
          result.m_data._0_16_ = vsubpd_avx(*(undefined1 (*) [16])p,auVar16);
          result.m_data[2] =
               (double)(((LhsEtorType *)(p + 2))->
                       super_unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::IndexBased,_double>
                       ).m_argImpl.
                       super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                       .m_d.data - dVar3 * 0.0;
          auVar6 = vcvtpd2ps_avx(auVar6);
          local_2c8.m_data._0_8_ = vmovlps_avx(auVar6);
          local_2c8.m_data[2] = 0.0;
          unique0x1000059e = SUB3228(ZEXT832(0),0);
          relRot.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array.
          _16_28_ = unique0x1000059e << 0x20;
          relRot.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5].
          _4_4_ = 0;
          ChCollisionPair::Set
                    ((ChCollisionPair *)&relRot,(ChGeometry *)mgeo1,(ChGeometry *)mgeo2,&result,
                     (ChVector<double> *)p,&local_2c8,(float *)0x0);
          ChNarrowPhaseCollider::AddCollisionPair(mcollider,(ChCollisionPair *)&relRot);
        }
        uVar9 = uVar9 + 1;
        p = p + 3;
      } while (uVar8 != uVar9);
    }
  }
  return 0;
}

Assistant:

int ChGeometryCollider::ComputeBoxBoxCollisions(
    geometry::ChBox& mgeo1,            ///< box 1
    ChMatrix33<>* R1,                  ///< absolute rotation of 1st model (with box 1)
    Vector* T1,                        ///< absolute position of 1st model (with box 1)
    geometry::ChBox& mgeo2,            ///< box 2
    ChMatrix33<>* R2,                  ///< absolute rotation of 2nd model (with box 2)
    Vector* T2,                        ///< absolute position of 2nd model (with box 2)
    ChNarrowPhaseCollider& mcollider,  ///< reference to a collider to store contacts into
    bool just_intersection  ///< if true, just report if intersecting (no further calculus on normal, depht, etc.)
) {
    if (just_intersection) {
        ChMatrix33<> relRot = R1->transpose() * (*R2);
        Vector relPos = R1->transpose() * ((*T2) - (*T1));

        if (CHOBB::OBB_Overlap(relRot, relPos, mgeo1.Size, mgeo2.Size)) {
            ChCollisionPair temp = ChCollisionPair(&mgeo1, &mgeo2);
            mcollider.AddCollisionPair(&temp);
            return 1;
        }
    } else {
        double ArrDist[12];  // 8 should be enough
        Vector ArrP[12];     // 8 should be enough
        Vector mnormal;

        int ncontacts = BoxBoxCollisionTest2::BoxBoxContacts(*T1, *R1, mgeo1.Size, *T2, *R2,
                                                             mgeo2.Size, CH_COLL_ENVELOPE, ArrP, mnormal, ArrDist);

        for (int i = 0; i < ncontacts; i++) {
            if (ArrDist[i] < CH_COLL_ENVELOPE) {
                ChCollisionPair temp = ChCollisionPair(&mgeo1, &mgeo2,  // geometries
                                                       Vadd(ArrP[i], Vmul(mnormal, -ArrDist[i])), ArrP[i],
                                                       mnormal);  // normal
                mcollider.AddCollisionPair(&temp);
            }
        }
    }
    return 0;
}